

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O2

ProtoWriter * __thiscall
google::protobuf::util::converter::ProtoWriter::RenderDataPiece
          (ProtoWriter *this,StringPiece name,DataPiece *data)

{
  string *psVar1;
  bool bVar2;
  Field *field;
  Type *type;
  stringpiece_ssize_type sVar3;
  StringPiece message;
  char *local_d8;
  undefined8 local_d0;
  AlphaNum local_a8;
  undefined1 local_78 [8];
  Status status;
  size_t local_48;
  
  Status::Status((Status *)local_78);
  if (this->invalid_depth_ < 1) {
    field = Lookup(this,name);
    if (field != (Field *)0x0) {
      bVar2 = ValidOneof(this,field,name);
      if (bVar2) {
        type = LookupType(this,field);
        if (type == (Type *)0x0) {
          local_d8 = "Missing descriptor for field: ";
          local_d0 = 0x1e;
          psVar1 = (field->type_url_).ptr_;
          local_a8.piece_data_ = (psVar1->_M_dataplus)._M_p;
          local_a8.piece_size_ = psVar1->_M_string_length;
          StrCat_abi_cxx11_((string *)((long)&status.error_message_.field_2 + 8),
                            (protobuf *)&local_d8,&local_a8,(AlphaNum *)local_a8.piece_data_);
          sVar3 = StringPiece::CheckedSsizeTFromSizeT(local_48);
          message.length_ = sVar3;
          message.ptr_ = (char *)status.error_message_.field_2._8_8_;
          InvalidName(this,name,message);
          std::__cxx11::string::~string((string *)(status.error_message_.field_2._M_local_buf + 8));
        }
        else {
          RenderPrimitiveField(this,field,type,data);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&status);
  return this;
}

Assistant:

ProtoWriter* ProtoWriter::RenderDataPiece(
    StringPiece name, const DataPiece& data) {
  Status status;
  if (invalid_depth_ > 0) return this;

  const google::protobuf::Field* field = Lookup(name);

  if (field == nullptr) return this;

  if (!ValidOneof(*field, name)) return this;

  const google::protobuf::Type* type = LookupType(field);
  if (type == nullptr) {
    InvalidName(name, StrCat("Missing descriptor for field: ",
                                   field->type_url()));
    return this;
  }

  return RenderPrimitiveField(*field, *type, data);
}